

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::B44Compressor::compress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  ulong uVar2;
  bool bVar3;
  unsigned_short uVar4;
  uint uVar5;
  ChannelData *pCVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  int i;
  int iVar10;
  uint uVar11;
  uint uVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  ConstIterator CVar15;
  long lVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  unsigned_short *puVar22;
  uint uVar23;
  uint uVar24;
  unsigned_short *puVar25;
  unsigned_short *puVar26;
  unsigned_short *puVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  ushort *__dest;
  int i_2;
  long lVar31;
  size_t sVar32;
  bool bVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [16];
  short sVar39;
  short sVar44;
  short sVar45;
  short sVar47;
  undefined4 uVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  ushort uVar48;
  unsigned_short s [16];
  int d [16];
  unsigned_short t [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  uint local_f8 [34];
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58 [5];
  undefined1 auVar37 [16];
  ushort uVar38;
  undefined1 auVar42 [16];
  
  *outPtr = this->_outBuffer;
  if (inSize == 0) {
    iVar30 = 0;
  }
  else {
    iVar30 = (range->min).x;
    iVar18 = (range->max).x;
    if (this->_maxX < iVar18) {
      iVar18 = this->_maxX;
    }
    uVar24 = (range->min).y;
    uVar21 = (range->max).y;
    if (this->_maxY < (int)uVar21) {
      uVar21 = this->_maxY;
    }
    puVar22 = this->_tmpBuffer;
    cVar13._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
    cVar14._M_node = (_Base_ptr)ChannelList::end(this->_channels);
    if (cVar13._M_node != cVar14._M_node) {
      lVar28 = 0;
      do {
        pCVar6 = this->_channelData;
        *(unsigned_short **)((long)&pCVar6->start + lVar28) = puVar22;
        *(unsigned_short **)((long)&pCVar6->end + lVar28) = puVar22;
        iVar10 = numSamples(*(int *)&cVar13._M_node[9].field_0x4,iVar30,iVar18);
        *(int *)((long)&pCVar6->nx + lVar28) = iVar10;
        iVar10 = numSamples(*(int *)&cVar13._M_node[9]._M_parent,uVar24,uVar21);
        *(int *)((long)&pCVar6->ny + lVar28) = iVar10;
        puVar22 = puVar22 + (long)*(int *)((long)&pCVar6->size + lVar28) *
                            (long)iVar10 * (long)*(int *)((long)&pCVar6->nx + lVar28);
        cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node);
        CVar15 = ChannelList::end(this->_channels);
        lVar28 = lVar28 + 0x28;
      } while ((const_iterator)cVar13._M_node != CVar15._i._M_node);
    }
    if (this->_format == XDR) {
      if ((int)uVar24 <= (int)uVar21) {
        iVar30 = this->_numChans;
        do {
          if (0 < iVar30) {
            lVar28 = 0;
            do {
              pCVar6 = this->_channelData;
              uVar12 = pCVar6[lVar28].ys;
              if ((int)uVar24 < 0) {
                if (-1 < (int)uVar12) {
                  uVar11 = (~uVar24 + uVar12) / uVar12;
                  goto LAB_0012cc8c;
                }
                uVar11 = (~uVar12 - uVar24) / -uVar12;
              }
              else if ((int)uVar12 < 0) {
                uVar11 = uVar24 / -uVar12;
LAB_0012cc8c:
                uVar11 = -uVar11;
              }
              else {
                uVar11 = uVar24 / uVar12;
              }
              if (uVar24 == uVar11 * uVar12) {
                iVar18 = pCVar6[lVar28].nx;
                if (pCVar6[lVar28].type == HALF) {
                  if (0 < iVar18) {
                    uVar12 = iVar18 + 1;
                    puVar22 = pCVar6[lVar28].end;
                    do {
                      uVar4 = *(unsigned_short *)inPtr;
                      inPtr = (char *)((long)inPtr + 2);
                      *puVar22 = uVar4;
                      pCVar6[lVar28].end = puVar22 + 1;
                      uVar12 = uVar12 - 1;
                      puVar22 = puVar22 + 1;
                    } while (1 < uVar12);
                  }
                }
                else {
                  lVar16 = (long)pCVar6[lVar28].size * (long)iVar18;
                  memcpy(pCVar6[lVar28].end,inPtr,lVar16 * 2);
                  inPtr = (char *)((long)inPtr + lVar16 * 2);
                  pCVar6[lVar28].end = pCVar6[lVar28].end + lVar16;
                  iVar30 = this->_numChans;
                }
              }
              lVar28 = lVar28 + 1;
            } while (lVar28 < iVar30);
          }
          bVar33 = uVar24 != uVar21;
          uVar24 = uVar24 + 1;
        } while (bVar33);
      }
    }
    else if ((int)uVar24 <= (int)uVar21) {
      iVar30 = this->_numChans;
      do {
        if (0 < iVar30) {
          lVar16 = 8;
          lVar28 = 0;
          do {
            pCVar6 = this->_channelData;
            uVar12 = *(uint *)((long)&pCVar6->nx + lVar16);
            if ((int)uVar24 < 0) {
              if (-1 < (int)uVar12) {
                uVar11 = (~uVar24 + uVar12) / uVar12;
                goto LAB_0012cd9d;
              }
              uVar11 = (~uVar12 - uVar24) / -uVar12;
            }
            else if ((int)uVar12 < 0) {
              uVar11 = uVar24 / -uVar12;
LAB_0012cd9d:
              uVar11 = -uVar11;
            }
            else {
              uVar11 = uVar24 / uVar12;
            }
            if (uVar24 == uVar11 * uVar12) {
              lVar31 = (long)*(int *)((long)&pCVar6->type + lVar16) *
                       (long)*(int *)((long)&pCVar6->end + lVar16);
              sVar32 = lVar31 * 2;
              memcpy(*(void **)((long)&pCVar6->start + lVar16),inPtr,sVar32);
              inPtr = inPtr + lVar31 * 2;
              plVar1 = (long *)((long)&pCVar6->start + lVar16);
              *plVar1 = *plVar1 + sVar32;
              iVar30 = this->_numChans;
            }
            lVar28 = lVar28 + 1;
            lVar16 = lVar16 + 0x28;
          } while (lVar28 < iVar30);
        }
        bVar33 = uVar24 != uVar21;
        uVar24 = uVar24 + 1;
      } while (bVar33);
    }
    __dest = (ushort *)this->_outBuffer;
    if (this->_numChans < 1) {
      iVar30 = (int)__dest;
    }
    else {
      local_70 = 0;
      do {
        pCVar6 = this->_channelData + local_70;
        if (pCVar6->type == HALF) {
          iVar30 = pCVar6->ny;
          if (0 < iVar30) {
            iVar18 = pCVar6->nx;
            uVar24 = 0;
            do {
              puVar26 = pCVar6->start + (int)(iVar18 * uVar24);
              puVar22 = puVar26 + iVar18;
              puVar27 = puVar22 + iVar18;
              if ((int)(uVar24 | 3) < iVar30) {
                puVar25 = puVar27 + iVar18;
              }
              else {
                if (iVar30 <= (int)(uVar24 | 1)) {
                  puVar22 = puVar26;
                }
                puVar25 = puVar27;
                if (iVar30 <= (int)(uVar24 | 2)) {
                  puVar25 = puVar22;
                  puVar27 = puVar22;
                }
              }
              if (0 < iVar18) {
                uVar21 = 0;
                do {
                  if ((int)(uVar21 | 3) < iVar18) {
                    local_118 = *(undefined8 *)puVar26;
                    local_110 = *(undefined8 *)puVar22;
                    local_108 = *(undefined8 *)puVar27;
                    local_100 = *(undefined8 *)puVar25;
                  }
                  else {
                    lVar28 = 0;
                    do {
                      iVar30 = (int)lVar28;
                      if ((int)(iVar18 + ~uVar21) < (int)lVar28) {
                        iVar30 = iVar18 + ~uVar21;
                      }
                      *(unsigned_short *)((long)&local_118 + lVar28 * 2) = puVar26[iVar30];
                      *(unsigned_short *)((long)&local_110 + lVar28 * 2) = puVar22[iVar30];
                      *(unsigned_short *)((long)&local_108 + lVar28 * 2) = puVar27[iVar30];
                      *(unsigned_short *)((long)&local_100 + lVar28 * 2) = puVar25[iVar30];
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 4);
                  }
                  bVar33 = pCVar6->pLinear;
                  if (bVar33 == true) {
                    lVar28 = 0;
                    do {
                      *(undefined2 *)((long)&local_118 + lVar28 * 2) =
                           *(undefined2 *)
                            ((anonymous_namespace)::expTable +
                            (ulong)*(ushort *)((long)&local_118 + lVar28 * 2) * 2);
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 0x10);
                  }
                  puVar26 = puVar26 + 4;
                  puVar22 = puVar22 + 4;
                  puVar27 = puVar27 + 4;
                  puVar25 = puVar25 + 4;
                  bVar3 = this->_optFlatFields;
                  lVar28 = 0;
                  do {
                    uVar38 = *(ushort *)((long)&local_118 + lVar28 * 2);
                    if ((~uVar38 & 0x7c00) == 0) {
                      *(undefined2 *)((long)local_58 + lVar28 * 2) = 0x8000;
                    }
                    else {
                      if ((short)uVar38 < 0) {
                        uVar38 = ~uVar38;
                      }
                      else {
                        uVar38 = uVar38 | 0x8000;
                      }
                      *(ushort *)((long)local_58 + lVar28 * 2) = uVar38;
                    }
                    lVar28 = lVar28 + 1;
                  } while (lVar28 != 0x10);
                  lVar28 = 0;
                  auVar41 = (undefined1  [16])0x0;
                  do {
                    auVar36 = psubusw(*(undefined1 (*) [16])((long)local_58 + lVar28 * 2),auVar41);
                    auVar34._0_2_ = auVar36._0_2_ + auVar41._0_2_;
                    auVar34._2_2_ = auVar36._2_2_ + auVar41._2_2_;
                    auVar34._4_2_ = auVar36._4_2_ + auVar41._4_2_;
                    auVar34._6_2_ = auVar36._6_2_ + auVar41._6_2_;
                    auVar34._8_2_ = auVar36._8_2_ + auVar41._8_2_;
                    auVar34._10_2_ = auVar36._10_2_ + auVar41._10_2_;
                    auVar37._12_2_ = auVar36._12_2_ + auVar41._12_2_;
                    auVar37._0_12_ = auVar34;
                    auVar37._14_2_ = auVar36._14_2_ + auVar41._14_2_;
                    lVar28 = lVar28 + 8;
                    auVar41 = auVar37;
                  } while (lVar28 != 0x10);
                  auVar40._4_4_ = auVar37._12_4_;
                  auVar40._0_4_ = auVar34._8_4_;
                  auVar40._8_4_ = auVar34._8_4_;
                  auVar40._12_4_ = auVar37._12_4_;
                  auVar41 = psubusw(auVar40,auVar37);
                  sVar39 = auVar41._0_2_ + auVar34._0_2_;
                  sVar44 = auVar41._2_2_ + auVar34._2_2_;
                  sVar45 = auVar41._4_2_ + auVar34._4_2_;
                  sVar47 = auVar41._6_2_ + auVar34._6_2_;
                  auVar42._0_8_ = CONCAT26(sVar47,CONCAT24(sVar45,CONCAT22(sVar44,sVar39)));
                  auVar42._8_2_ = auVar41._8_2_ + auVar34._8_2_;
                  auVar42._10_2_ = auVar41._10_2_ + auVar34._10_2_;
                  auVar42._12_2_ = auVar41._12_2_ + auVar37._12_2_;
                  auVar42._14_2_ = auVar41._14_2_ + auVar37._14_2_;
                  uVar46 = (undefined4)((ulong)auVar42._0_8_ >> 0x20);
                  auVar41._4_4_ = uVar46;
                  auVar41._0_4_ = uVar46;
                  auVar41._8_4_ = uVar46;
                  auVar41._12_4_ = uVar46;
                  auVar41 = psubusw(auVar41,auVar42);
                  sVar39 = auVar41._0_2_ + sVar39;
                  uVar38 = auVar41._2_2_ + sVar44;
                  auVar35._0_8_ =
                       CONCAT26(auVar41._6_2_ + sVar47,
                                CONCAT24(auVar41._4_2_ + sVar45,CONCAT22(uVar38,sVar39)));
                  auVar35._8_2_ = auVar41._8_2_ + auVar42._8_2_;
                  auVar35._10_2_ = auVar41._10_2_ + auVar42._10_2_;
                  auVar36._12_2_ = auVar41._12_2_ + auVar42._12_2_;
                  auVar36._0_12_ = auVar35;
                  auVar36._14_2_ = auVar41._14_2_ + auVar42._14_2_;
                  auVar43._2_2_ = 0;
                  auVar43._0_2_ = uVar38;
                  auVar43._4_4_ = (uint)((ulong)auVar35._0_8_ >> 0x30);
                  auVar43._8_4_ = auVar35._8_4_ >> 0x10;
                  auVar43._12_4_ = auVar36._12_4_ >> 0x10;
                  auVar41 = psubusw(auVar43,auVar36);
                  uVar38 = auVar41._0_2_ + sVar39;
                  uVar12 = (uint)uVar38;
                  iVar30 = -1;
                  do {
                    iVar18 = iVar30 + 1;
                    bVar17 = (byte)iVar18;
                    uVar11 = iVar30 + 2;
                    uVar19 = ~(-1 << (bVar17 & 0x1f));
                    lVar28 = 0;
                    do {
                      uVar2 = *(ulong *)((long)local_58 + lVar28 * 2);
                      uVar48 = (ushort)(uVar2 >> 0x30);
                      auVar7._8_4_ = 0;
                      auVar7._0_8_ = uVar2;
                      auVar7._12_2_ = uVar48;
                      auVar8._8_2_ = (short)(uVar2 >> 0x20);
                      auVar8._0_8_ = uVar2;
                      auVar8._10_4_ = auVar7._10_4_;
                      auVar9._6_8_ = 0;
                      auVar9._0_6_ = auVar8._8_6_;
                      uVar20 = (uVar12 - (ushort)uVar2) * 2;
                      uVar23 = (uVar12 - (int)CONCAT82(SUB148(auVar9 << 0x40,6),
                                                       (short)(uVar2 >> 0x10))) * 2;
                      uVar29 = (uVar12 - auVar8._8_4_) * 2;
                      uVar5 = (uVar12 - uVar48) * 2;
                      uVar2 = (ulong)uVar11;
                      local_f8[lVar28] =
                           (int)(uVar20 + uVar19 + (uVar20 >> uVar2 & 1)) >> ZEXT416(uVar11);
                      local_f8[lVar28 + 1] =
                           (int)(uVar23 + uVar19 + (uVar23 >> uVar2 & 1)) >> ZEXT416(uVar11);
                      local_f8[lVar28 + 2] =
                           (int)(uVar29 + uVar19 + (uVar29 >> uVar2 & 1)) >> ZEXT416(uVar11);
                      local_f8[lVar28 + 3] =
                           (int)(uVar5 + uVar19 + (uVar5 >> uVar2 & 1)) >> ZEXT416(uVar11);
                      lVar28 = lVar28 + 4;
                    } while (lVar28 != 0x10);
                    uVar29 = local_f8[0] - local_f8[4];
                    local_68 = (ulong)uVar29;
                    uVar20 = local_f8[4] - local_f8[8];
                    local_60 = (ulong)uVar20;
                    local_f8[0x11] = uVar20 + 0x20;
                    local_f8[0x12] = (local_f8[8] - local_f8[0xc]) + 0x20;
                    local_f8[0x13] = (local_f8[0] - local_f8[1]) + 0x20;
                    local_f8[0x14] = (local_f8[4] - local_f8[5]) + 0x20;
                    local_f8[0x15] = (local_f8[8] - local_f8[9]) + 0x20;
                    local_f8[0x16] = (local_f8[0xc] - local_f8[0xd]) + 0x20;
                    local_f8[0x17] = (local_f8[1] - local_f8[2]) + 0x20;
                    local_f8[0x18] = (local_f8[5] - local_f8[6]) + 0x20;
                    local_f8[0x19] = (local_f8[9] - local_f8[10]) + 0x20;
                    local_f8[0x1a] = (local_f8[0xd] - local_f8[0xe]) + 0x20;
                    local_f8[0x1b] = (local_f8[2] - local_f8[3]) + 0x20;
                    local_f8[0x1c] = (local_f8[6] - local_f8[7]) + 0x20;
                    local_f8[0x1d] = (local_f8[10] - local_f8[0xb]) + 0x20;
                    local_f8[0x1e] = (local_f8[0xe] - local_f8[0xf]) + 0x20;
                    uVar23 = uVar29 + 0x20;
                    lVar28 = 1;
                    uVar11 = uVar23;
                    uVar19 = uVar23;
                    do {
                      uVar5 = local_f8[lVar28 + 0x10];
                      if ((int)uVar5 <= (int)uVar19) {
                        uVar19 = uVar5;
                      }
                      if ((int)uVar5 < (int)uVar11) {
                        uVar5 = uVar11;
                      }
                      uVar11 = uVar5;
                      lVar28 = lVar28 + 1;
                    } while (lVar28 != 0xf);
                    iVar30 = iVar18;
                  } while (((int)uVar19 < 0) || (0x3f < (int)uVar11));
                  uVar48 = (ushort)local_58[0];
                  if ((uVar19 == 0x20) && ((uVar11 == 0x20 && (bVar3 != false)))) {
                    lVar28 = 3;
                    bVar17 = 0xfc;
                    lVar16 = 2;
                  }
                  else {
                    if (bVar33 == false) {
                      uVar48 = uVar38 - (short)(local_f8[0] << (bVar17 & 0x1f));
                    }
                    *(byte *)(__dest + 1) = (byte)(uVar23 >> 4) | bVar17 * '\x04';
                    *(byte *)((long)__dest + 3) = (byte)(uVar20 + 0x20 >> 2) | (char)uVar29 * '\x10'
                    ;
                    *(byte *)(__dest + 2) = (byte)local_f8[0x12] | (char)uVar20 * '@';
                    *(byte *)((long)__dest + 5) =
                         (byte)(local_f8[0x14] >> 4) | (char)local_f8[0x13] * '\x04';
                    *(byte *)(__dest + 3) =
                         (byte)(local_f8[0x15] >> 2) | (char)(local_f8[4] - local_f8[5]) * '\x10';
                    *(byte *)((long)__dest + 7) =
                         (byte)local_f8[0x16] | (char)(local_f8[8] - local_f8[9]) * '@';
                    *(byte *)(__dest + 4) =
                         (byte)(local_f8[0x18] >> 4) | (char)local_f8[0x17] * '\x04';
                    *(byte *)((long)__dest + 9) =
                         (byte)(local_f8[0x19] >> 2) | (char)(local_f8[5] - local_f8[6]) * '\x10';
                    *(byte *)(__dest + 5) =
                         (byte)local_f8[0x1a] | (char)(local_f8[9] - local_f8[10]) * '@';
                    *(byte *)((long)__dest + 0xb) =
                         (byte)(local_f8[0x1c] >> 4) | (char)local_f8[0x1b] * '\x04';
                    *(byte *)(__dest + 6) =
                         (byte)(local_f8[0x1d] >> 2) | (char)(local_f8[6] - local_f8[7]) * '\x10';
                    bVar17 = (byte)local_f8[0x1e] | (char)(local_f8[10] - local_f8[0xb]) * '@';
                    lVar28 = 0xe;
                    lVar16 = 0xd;
                  }
                  *__dest = uVar48 << 8 | uVar48 >> 8;
                  *(byte *)((long)__dest + lVar16) = bVar17;
                  __dest = (ushort *)((long)__dest + lVar28);
                  uVar21 = uVar21 + 4;
                  iVar18 = pCVar6->nx;
                } while ((int)uVar21 < iVar18);
                iVar30 = pCVar6->ny;
              }
              uVar24 = uVar24 + 4;
            } while ((int)uVar24 < iVar30);
          }
        }
        else {
          sVar32 = (size_t)(pCVar6->nx * pCVar6->ny * pCVar6->size * 2);
          memcpy(__dest,pCVar6->start,sVar32);
          __dest = (ushort *)((long)__dest + sVar32);
        }
        local_70 = local_70 + 1;
      } while (local_70 < this->_numChans);
      iVar30 = (int)this->_outBuffer;
    }
    iVar30 = (int)__dest - iVar30;
  }
  return iVar30;
}

Assistant:

int
B44Compressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // Compress a block of pixel data:  First copy the input pixels
    // from the input buffer into _tmpBuffer, rearranging them such
    // that blocks of 4x4 pixels of a single channel can be accessed
    // conveniently.  Then compress each 4x4 block of HALF pixel data
    // and append the result to the output buffer.  Copy UINT and
    // FLOAT data to the output buffer without compressing them.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	//
	// Special case - empty input buffer.
	//

	return 0;
    }

    //
    // For each channel, detemine how many pixels are stored
    // in the input buffer, and where those pixels will be
    // placed in _tmpBuffer.
    //

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// The data in the input buffer are in the machine-independent
	// Xdr format.  Copy the HALF channels into _tmpBuffer and
	// convert them back into native format for compression.
	// Copy UINT and FLOAT channels verbatim into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::read <CharPtrIO> (inPtr, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		    inPtr += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	//
	// The input buffer contains only HALF channels, and they
	// are in native, machine-dependent format.  Copy the pixels
	// into _tmpBuffer.
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    //
    // The pixels for each channel have been packed into a contiguous
    // block in _tmpBuffer.  HALF channels are in native format; UINT
    // and FLOAT channels are in Xdr format.
    //

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // For each HALF channel, split the data in _tmpBuffer into 4x4
    // pixel blocks.  Compress each block and append the compressed
    // data to the output buffer.
    //
    // UINT and FLOAT channels are copied from _tmpBuffer into the
    // output buffer without further processing.
    //

    char *outEnd = _outBuffer;

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];
	
	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);
	    memcpy (outEnd, cd.start, n);
	    outEnd += n;

	    continue;
	}
	
	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    //
	    // Copy the next 4x4 pixel block into array s.
	    // If the width, cd.nx, or the height, cd.ny, of
	    // the pixel data in _tmpBuffer is not divisible
	    // by 4, then pad the data by repeating the
	    // rightmost column and the bottom row.
	    // 

	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    if (y + 3 >= cd.ny)
	    {
		if (y + 1 >= cd.ny)
		    row1 = row0;

		if (y + 2 >= cd.ny)
		    row2 = row1;

		row3 = row2;
	    }

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16];

		if (x + 3 >= cd.nx)
		{
		    int n = cd.nx - x;

		    for (int i = 0; i < 4; ++i)
		    {
			int j = min (i, n - 1);

			s[i +  0] = row0[j];
			s[i +  4] = row1[j];
			s[i +  8] = row2[j];
			s[i + 12] = row3[j];
		    }
		}
		else
		{
		    memcpy (&s[ 0], row0, 4 * sizeof (unsigned short));
		    memcpy (&s[ 4], row1, 4 * sizeof (unsigned short));
		    memcpy (&s[ 8], row2, 4 * sizeof (unsigned short));
		    memcpy (&s[12], row3, 4 * sizeof (unsigned short));
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;

		//
		// Compress the contents of array s and append the
		// results to the output buffer.
		//

		if (cd.pLinear)
		    convertFromLinear (s);

		outEnd += pack (s, (unsigned char *) outEnd,
				_optFlatFields, !cd.pLinear);
	    }
	}
    }

    return outEnd - _outBuffer;
}